

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O2

_Bool trans_VMOV_from_gp(DisasContext_conflict1 *s,arg_VMOV_from_gp *a)

{
  TCGContext_conflict1 *tcg_ctx;
  uint len;
  _Bool _Var1;
  TCGv_i32 ret;
  TCGv_i32 arg1;
  uint uVar2;
  uint pass;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (a->size == 2) {
    uVar2 = s->isar->mvfr0;
    if ((uVar2 & 0xf0) == 0) {
      return false;
    }
  }
  else {
    if ((s->features & 0x100) == 0) {
      return false;
    }
    uVar2 = s->isar->mvfr0;
  }
  if (((uVar2 & 0xe) == 0) && ((a->vn & 0x10) != 0)) {
    return false;
  }
  uVar2 = a->index << ((byte)a->size & 0x1f);
  _Var1 = vfp_access_check(s);
  if (!_Var1) {
    return true;
  }
  pass = uVar2 >> 2 & 1;
  ret = load_reg(s,a->rt);
  if (a->size == 0) {
    len = 8;
  }
  else {
    if (a->size != 1) goto LAB_005f715f;
    len = 0x10;
  }
  arg1 = neon_load_reg(tcg_ctx,a->vn,pass);
  tcg_gen_deposit_i32_aarch64(tcg_ctx,ret,arg1,ret,(uVar2 & 3) << 3,len);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
LAB_005f715f:
  neon_store_reg(tcg_ctx,a->vn,pass,ret);
  return true;
}

Assistant:

static bool trans_VMOV_from_gp(DisasContext *s, arg_VMOV_from_gp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* VMOV general purpose register to scalar */
    TCGv_i32 tmp, tmp2;
    int pass;
    uint32_t offset;

    /* SIZE == 2 is a VFP instruction; otherwise NEON.  */
    if (a->size == 2
        ? !dc_isar_feature(aa32_fpsp_v2, s)
        : !arm_dc_feature(s, ARM_FEATURE_NEON)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vn & 0x10)) {
        return false;
    }

    offset = a->index << a->size;
    pass = extract32(offset, 2, 1);
    offset = extract32(offset, 0, 2) * 8;

    if (!vfp_access_check(s)) {
        return true;
    }

    tmp = load_reg(s, a->rt);
    switch (a->size) {
    case 0:
        tmp2 = neon_load_reg(tcg_ctx, a->vn, pass);
        tcg_gen_deposit_i32(tcg_ctx, tmp, tmp2, tmp, offset, 8);
        tcg_temp_free_i32(tcg_ctx, tmp2);
        break;
    case 1:
        tmp2 = neon_load_reg(tcg_ctx, a->vn, pass);
        tcg_gen_deposit_i32(tcg_ctx, tmp, tmp2, tmp, offset, 16);
        tcg_temp_free_i32(tcg_ctx, tmp2);
        break;
    case 2:
        break;
    }
    neon_store_reg(tcg_ctx, a->vn, pass, tmp);

    return true;
}